

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v11::detail::compare(bigint *b1,bigint *b2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  buffer<unsigned_int> *in_RSI;
  buffer<unsigned_int> *in_RDI;
  bigit b2_bigit;
  bigit b1_bigit;
  int end;
  int j;
  int i;
  int num_bigits2;
  int num_bigits1;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  int local_4;
  
  iVar1 = bigint::num_bigits((bigint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                            );
  iVar2 = bigint::num_bigits((bigint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                            );
  if (iVar1 == iVar2) {
    sVar3 = buffer<unsigned_int>::size(in_RDI);
    local_24 = (int)sVar3 + -1;
    sVar3 = buffer<unsigned_int>::size(in_RSI);
    local_28 = (int)sVar3 + -1;
    iVar1 = local_24 - local_28;
    if (iVar1 < 0) {
      iVar1 = 0;
    }
    for (; iVar1 <= local_24; local_24 = local_24 + -1) {
      puVar4 = buffer<unsigned_int>::operator[]<int>(in_RDI,local_24);
      uVar5 = *puVar4;
      puVar4 = buffer<unsigned_int>::operator[]<int>(in_RSI,local_28);
      if (uVar5 != *puVar4) {
        if (uVar5 <= *puVar4) {
          return -1;
        }
        return 1;
      }
      local_28 = local_28 + -1;
    }
    if (local_24 == local_28) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
      if (local_28 < local_24) {
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = -1;
    if (iVar2 < iVar1) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR auto compare(const bigint& b1, const bigint& b2) -> int {
    int num_bigits1 = b1.num_bigits(), num_bigits2 = b2.num_bigits();
    if (num_bigits1 != num_bigits2) return num_bigits1 > num_bigits2 ? 1 : -1;
    int i = static_cast<int>(b1.bigits_.size()) - 1;
    int j = static_cast<int>(b2.bigits_.size()) - 1;
    int end = i - j;
    if (end < 0) end = 0;
    for (; i >= end; --i, --j) {
      bigit b1_bigit = b1.bigits_[i], b2_bigit = b2.bigits_[j];
      if (b1_bigit != b2_bigit) return b1_bigit > b2_bigit ? 1 : -1;
    }
    if (i != j) return i > j ? 1 : -1;
    return 0;
  }